

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1593.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  CURLcode CVar2;
  undefined8 uVar3;
  long lVar4;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  int res;
  CURL *curl;
  long unmet;
  curl_slist *header;
  char *URL_local;
  
  unmet = 0;
  ec_1 = CURLE_OK;
  header = (curl_slist *)URL;
  CVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (CVar2 != CURLE_OK) {
    uVar3 = curl_easy_strerror(CVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                  ,0x24,CVar2,uVar3);
    ec_1 = CVar2;
  }
  if (ec_1 == CURLE_OK) {
    lVar4 = curl_easy_init();
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                    ,0x26);
      ec_1 = CURLE_QUIC_CONNECT_ERROR|CURLE_OPERATION_TIMEDOUT;
    }
    if (ec_1 == CURLE_OK) {
      CVar2 = curl_easy_setopt(lVar4,0x2712,header);
      uVar1 = _stderr;
      if (CVar2 != CURLE_OK) {
        uVar3 = curl_easy_strerror(CVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                      ,0x28,CVar2,uVar3);
        ec_1 = CVar2;
      }
      if (ec_1 == CURLE_OK) {
        CVar2 = curl_easy_setopt(lVar4,0x21,1);
        uVar1 = _stderr;
        if (CVar2 != CURLE_OK) {
          uVar3 = curl_easy_strerror(CVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                        ,0x29,CVar2,uVar3);
          ec_1 = CVar2;
        }
        if (ec_1 == CURLE_OK) {
          CVar2 = curl_easy_setopt(lVar4,0x22,0x5d5a7a78);
          uVar1 = _stderr;
          if (CVar2 != CURLE_OK) {
            uVar3 = curl_easy_strerror(CVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                          ,0x2b,CVar2,uVar3);
            ec_1 = CVar2;
          }
          if (ec_1 == CURLE_OK) {
            unmet = curl_slist_append(0,"If-Modified-Since:");
            if (unmet == 0) {
              ec_1 = CURLE_QUIC_CONNECT_ERROR|CURLE_FTP_PORT_FAILED;
            }
            else {
              CVar2 = curl_easy_setopt(lVar4,0x2727,unmet);
              uVar1 = _stderr;
              if (CVar2 != CURLE_OK) {
                uVar3 = curl_easy_strerror(CVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                              ,0x33,CVar2,uVar3);
                ec_1 = CVar2;
              }
              if ((((ec_1 == CURLE_OK) && (ec_1 = curl_easy_perform(lVar4), ec_1 == CURLE_OK)) &&
                  (ec_1 = curl_easy_getinfo(lVar4,0x200023,&curl), ec_1 == CURLE_OK)) &&
                 (curl != (CURL *)0x1)) {
                ec_1 = CURLE_QUIC_CONNECT_ERROR|CURLE_WRITE_ERROR;
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(lVar4);
    curl_slist_free_all(unmet);
    curl_global_cleanup();
    URL_local._4_4_ = ec_1;
  }
  else {
    URL_local._4_4_ = ec_1;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  struct curl_slist *header = NULL;
  long unmet;
  CURL *curl = NULL;
  int res = 0;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_TIMECONDITION, (long)CURL_TIMECOND_IFMODSINCE);
  /* Some TIMEVALUE; it doesn't matter. */
  easy_setopt(curl, CURLOPT_TIMEVALUE, 1566210680L);

  header = curl_slist_append(NULL, "If-Modified-Since:");
  if(!header) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  easy_setopt(curl, CURLOPT_HTTPHEADER, header);

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  /* Confirm that the condition checking still worked, even though we
   * suppressed the actual header.
   * The server returns 304, which means the condition is "unmet".
   */

  res = curl_easy_getinfo(curl, CURLINFO_CONDITION_UNMET, &unmet);
  if(res)
    goto test_cleanup;

  if(unmet != 1L) {
    res = TEST_ERR_FAILURE;
    goto test_cleanup;
  }

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);
  curl_slist_free_all(header);
  curl_global_cleanup();

  return res;
}